

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

bool tchecker::system::is_deterministic(system_t *system)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  processes_identifiers_range_t pVar1;
  const_iterator_t __r;
  const_iterator __r_00;
  const_iterator_t cVar2;
  integer_iterator_t<unsigned_int> pid;
  processes_identifiers_range_t pVar3;
  bool bVar4;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar5;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar6;
  reference rVar7;
  loc_const_shared_ptr_t l;
  edge_const_shared_ptr_t e;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> outevents;
  
  pVar1 = processes_t::processes_identifiers(&system->super_processes_t);
  pVar3 = pVar1;
  while (pid = pVar3._begin._current, pVar1._end._current._current != pid._current) {
    rVar5 = locs_t::initial_locations(&system->super_locs_t,pid._current);
    pVar3._begin._current = pid._current + 1;
    pVar3._end._current = 0;
    if (0x10 < (long)rVar5._end.super_const_iterator._M_current.super_const_iterator -
               (long)rVar5._begin.super_const_iterator._M_current) {
      return false;
    }
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&outevents,
             ((long)(system->super_events_t)._events_attributes.
                    super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(system->super_events_t)._events_attributes.
                   super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38,0,
             (allocator<unsigned_long> *)&l);
  rVar5 = locs_t::locations(&system->super_locs_t);
  cVar2 = rVar5._end.super_const_iterator._M_current;
  this = &e.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  do {
    __r = rVar5._begin.super_const_iterator._M_current;
    bVar4 = __r.super_const_iterator._M_current ==
            (shared_ptr<tchecker::system::loc_t> *)rVar5._end.super_const_iterator._M_current;
    if (bVar4) {
LAB_0013f7d4:
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&outevents);
      return bVar4;
    }
    std::__shared_ptr<tchecker::system::loc_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::loc_t,void>
              ((__shared_ptr<tchecker::system::loc_t_const,(__gnu_cxx::_Lock_policy)2> *)&l,
               (__shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2> *)
               __r.super_const_iterator._M_current);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(&outevents);
    rVar6 = edges_t::outgoing_edges
                      (&system->super_edges_t,
                       (l.
                        super___shared_ptr<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_id);
    for (__r_00._M_current =
              (shared_ptr<tchecker::system::edge_t> *)rVar6._begin.super_const_iterator._M_current;
        (const_iterator)__r_00._M_current !=
        rVar6._end.super_const_iterator._M_current.super_const_iterator;
        __r_00._M_current = __r_00._M_current + 1) {
      std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<tchecker::system::edge_t,void>
                ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)&e,
                 &(__r_00._M_current)->
                  super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>);
      rVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&outevents,
                         (ulong)(e.
                                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_event_id);
      if ((*rVar7.m_block & rVar7.m_mask) != 0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&l.super___shared_ptr<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        goto LAB_0013f7d4;
      }
      rVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&outevents,
                         (ulong)(e.
                                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_event_id);
      *rVar7.m_block = *rVar7.m_block | rVar7.m_mask;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&l.super___shared_ptr<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    rVar5._end.super_const_iterator._M_current = cVar2.super_const_iterator._M_current;
    rVar5._begin.super_const_iterator._M_current =
         (const_iterator)(const_iterator)((long)__r.super_const_iterator._M_current + 0x10);
  } while( true );
}

Assistant:

bool is_deterministic(tchecker::system::system_t const & system)
{
  // Check that each process has only one initial location
  for (tchecker::process_id_t const pid : system.processes_identifiers()) {
    auto initial_locations = system.initial_locations(pid);
    if (std::distance(initial_locations.begin(), initial_locations.end()) > 1)
      return false;
  }

  // Check that every location has at most one outgoing edge for each event
  boost::dynamic_bitset<> outevents(system.events_count(), 0);
  for (tchecker::system::loc_const_shared_ptr_t l : system.locations()) {
    outevents.reset();
    for (tchecker::system::edge_const_shared_ptr_t e : system.outgoing_edges(l->id())) {
      if (outevents[e->event_id()])
        return false;
      outevents[e->event_id()] = 1;
    }
  }
  return true;
}